

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

void __thiscall helics::InterfaceInfo::reset(InterfaceInfo *this)

{
  long in_RDI;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *in_stack_ffffffffffffff80;
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *this_00;
  undefined1 local_60 [64];
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  local_20;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)in_stack_ffffffffffffff78);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::operator->(&local_20);
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           *)in_stack_ffffffffffffff80);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5c1a9d);
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          *)in_stack_ffffffffffffff78);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::operator->((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)(local_60 + 0x18));
  gmlc::containers::
  DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear(in_stack_ffffffffffffff80);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5c1ad6);
  this_00 = (DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             *)local_60;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff78);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::operator->((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)this_00);
  gmlc::containers::
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::clear(this_00);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5c1b0f);
  *(undefined1 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

void InterfaceInfo::reset()
{
    publications.lock()->clear();
    inputs.lock()->clear();
    endpoints.lock()->clear();
    only_update_on_change = false;
}